

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ShowMetricsWindow::Funcs::NodeWindow(ImGuiWindow *window,char *label)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ImGuiStoragePair *pIVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  char *pcVar8;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *pcVar9;
  uint uVar10;
  char *pcVar11;
  ulong uVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  ImGuiColumns *pIVar18;
  long lVar19;
  char *pcVar20;
  long lVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  ImVec2 local_38;
  
  if (window == (ImGuiWindow *)0x0) {
    BulletText("%s: NULL",label);
    return;
  }
  bVar7 = window->WasActive;
  uVar10 = (uint)(GImGui->NavWindow == window);
  if (bVar7 == false) {
    PushStyleColor(0,(GImGui->Style).Colors + 1);
    bVar5 = TreeNodeEx(label,uVar10,"%s \'%s\'%s",label,window->Name," *Inactive*");
    PopStyleColor(1);
    IsItemHovered(0);
    pcVar9 = extraout_RDX_01;
  }
  else {
    bVar5 = TreeNodeEx(label,uVar10,"%s \'%s\'%s",label,window->Name,"");
    bVar6 = IsItemHovered(0);
    pcVar9 = extraout_RDX;
    if ((bVar6 & bVar7) == 1) {
      local_38.x = (window->Size).x + (window->Pos).x;
      local_38.y = (window->Size).y + (window->Pos).y;
      ImDrawList::AddRect(&GImGui->ForegroundDrawList,&window->Pos,&local_38,0xff00ffff,0.0,0xf,1.0)
      ;
      pcVar9 = extraout_RDX_00;
    }
  }
  if (bVar5 == false) {
    return;
  }
  if (window->MemoryCompacted == true) {
    TextDisabled("Note: some memory buffers have been compacted/freed.");
    pcVar9 = extraout_RDX_02;
  }
  uVar10 = window->Flags;
  NodeDrawList(window,window->DrawList,pcVar9);
  BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f)",(double)(window->Pos).x,
             (double)(window->Pos).y,(double)(window->Size).x,(double)(window->Size).y,
             (double)(window->ContentSize).x,(double)(window->ContentSize).y);
  pcVar9 = "Child ";
  if ((uVar10 >> 0x18 & 1) == 0) {
    pcVar9 = "";
  }
  auVar24._0_4_ = -(uint)((uVar10 & 0x10000000) == 0);
  auVar24._4_4_ = -(uint)((uVar10 & 0x8000000) == 0);
  auVar24._8_4_ = -(uint)((uVar10 & 0x4000000) == 0);
  auVar24._12_4_ = -(uint)((uVar10 & 0x2000000) == 0);
  auVar23._0_4_ = -(uint)((uVar10 & 0x40) == 0);
  auVar23._4_4_ = -(uint)((uVar10 & 0x40000) == 0);
  auVar23._8_4_ = -(uint)((uVar10 & 0x200) == 0);
  auVar23._12_4_ = -(uint)((uVar10 & 0x100) == 0);
  auVar24 = packssdw(auVar23,auVar24);
  auVar24 = packsswb(auVar24,auVar24);
  pcVar8 = "Tooltip ";
  if ((auVar24 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar8 = "";
  }
  pcVar11 = "Popup ";
  if ((auVar24 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar11 = "";
  }
  pcVar13 = "Modal ";
  if ((auVar24 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar13 = "";
  }
  pcVar14 = "ChildMenu ";
  if ((auVar24 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar14 = "";
  }
  pcVar15 = "NoSavedSettings ";
  if ((auVar24 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar15 = "";
  }
  pcVar20 = "NoMouseInputs";
  if ((auVar24 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar20 = "";
  }
  pcVar16 = "NoNavInputs";
  if ((auVar24 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar16 = "";
  }
  pcVar17 = "AlwaysAutoResize";
  if ((auVar24 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar17 = "";
  }
  BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)",(ulong)uVar10,pcVar9,pcVar8,pcVar11,pcVar13,
             pcVar14,pcVar15,pcVar20,pcVar16,pcVar17);
  pcVar9 = "##X";
  if (window->ScrollbarX == false) {
    pcVar9 = " \t";
  }
  pcVar8 = "##Y";
  if (window->ScrollbarY == false) {
    pcVar8 = " \t";
  }
  BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s",(double)(window->Scroll).x,
             (double)(window->ScrollMax).x,(double)(window->Scroll).y,(double)(window->ScrollMax).y,
             pcVar9 + 2,pcVar8 + 2);
  if ((window->Active != false) || (uVar12 = 0xffffffff, window->WasActive != false)) {
    uVar12 = (ulong)(uint)(int)window->BeginOrderWithinContext;
  }
  BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d",(ulong)window->Active,
             (ulong)window->WasActive,(ulong)window->WriteAccessed,uVar12);
  BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d",
             (ulong)window->Appearing,(ulong)window->Hidden,
             (ulong)(uint)window->HiddenFramesCanSkipItems,
             (ulong)(uint)window->HiddenFramesCannotSkipItems,(ulong)window->SkipItems);
  BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X",(ulong)window->NavLastIds[0],
             (ulong)window->NavLastIds[1],(ulong)(uint)(window->DC).NavLayerActiveMask);
  if (window->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
    pcVar9 = "NULL";
  }
  else {
    pcVar9 = window->NavLastChildNavWindow->Name;
  }
  BulletText("NavLastChildNavWindow: %s",pcVar9);
  fVar1 = window->NavRectRel[0].Min.x;
  fVar22 = window->NavRectRel[0].Max.x;
  if (fVar1 <= fVar22) {
    fVar2 = window->NavRectRel[0].Min.y;
    fVar3 = window->NavRectRel[0].Max.y;
    if (fVar2 <= fVar3) {
      BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)",(double)fVar1,(double)fVar2,(double)fVar22,
                 (double)fVar3);
      goto LAB_00153380;
    }
  }
  BulletText("NavRectRel[0]: <None>");
LAB_00153380:
  if (window->RootWindow != window) {
    NodeWindow(window->RootWindow,"RootWindow");
  }
  if (window->ParentWindow != (ImGuiWindow *)0x0) {
    NodeWindow(window->ParentWindow,"ParentWindow");
  }
  if (0 < (window->DC).ChildWindows.Size) {
    NodeWindows(&(window->DC).ChildWindows,"ChildWindows");
  }
  if ((0 < (window->ColumnsStorage).Size) &&
     (bVar7 = TreeNode("Columns","Columns sets (%d)"), bVar7)) {
    if (0 < (window->ColumnsStorage).Size) {
      lVar21 = 0;
      do {
        pIVar18 = (window->ColumnsStorage).Data;
        bVar7 = TreeNode((void *)(ulong)pIVar18[lVar21].ID,
                         "Columns Id: 0x%08X, Count: %d, Flags: 0x%04X",
                         (void *)(ulong)pIVar18[lVar21].ID,(ulong)(uint)pIVar18[lVar21].Count,
                         (ulong)(uint)pIVar18[lVar21].Flags);
        if (bVar7) {
          pIVar18 = pIVar18 + lVar21;
          BulletText("Width: %.1f (MinX: %.1f, MaxX: %.1f)",
                     (double)(pIVar18->OffMaxX - pIVar18->OffMinX),(double)pIVar18->OffMinX,
                     (double)pIVar18->OffMaxX);
          if (0 < (pIVar18->Columns).Size) {
            lVar19 = 0;
            uVar12 = 0;
            do {
              fVar1 = *(float *)((long)&((pIVar18->Columns).Data)->OffsetNorm + lVar19);
              fVar22 = GetColumnOffsetFromNorm(pIVar18,fVar1);
              BulletText("Column %02d: OffsetNorm %.3f (= %.1f px)",(double)fVar1,(double)fVar22,
                         uVar12 & 0xffffffff);
              uVar12 = uVar12 + 1;
              lVar19 = lVar19 + 0x1c;
            } while ((long)uVar12 < (long)(pIVar18->Columns).Size);
          }
          TreePop();
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 < (window->ColumnsStorage).Size);
    }
    TreePop();
  }
  uVar10 = (window->StateStorage).Data.Size;
  bVar7 = TreeNode("Storage","%s: %d entries, %d bytes","Storage",(ulong)uVar10,(ulong)(uVar10 << 4)
                  );
  if (bVar7) {
    if (0 < (window->StateStorage).Data.Size) {
      lVar19 = 8;
      lVar21 = 0;
      do {
        pIVar4 = (window->StateStorage).Data.Data;
        BulletText("Key 0x%08X Value { i: %d }",(ulong)*(uint *)((long)pIVar4 + lVar19 + -8),
                   (ulong)*(uint *)((long)&pIVar4->key + lVar19));
        lVar21 = lVar21 + 1;
        lVar19 = lVar19 + 0x10;
      } while (lVar21 < (window->StateStorage).Data.Size);
    }
    TreePop();
  }
  TreePop();
  return;
}

Assistant:

static void NodeWindow(ImGuiWindow* window, const char* label)
        {
            if (window == NULL)
            {
                ImGui::BulletText("%s: NULL", label);
                return;
            }

            ImGuiContext& g = *GImGui;
            const bool is_active = window->WasActive;
            ImGuiTreeNodeFlags tree_node_flags = (window == g.NavWindow) ? ImGuiTreeNodeFlags_Selected : ImGuiTreeNodeFlags_None;
            if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
            const bool open = ImGui::TreeNodeEx(label, tree_node_flags, "%s '%s'%s", label, window->Name, is_active ? "" : " *Inactive*");
            if (!is_active) { PopStyleColor(); }
            if (ImGui::IsItemHovered() && is_active)
                ImGui::GetForegroundDrawList(window)->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!open)
                return;

            if (window->MemoryCompacted)
                ImGui::TextDisabled("Note: some memory buffers have been compacted/freed.");

            ImGuiWindowFlags flags = window->Flags;
            NodeDrawList(window, window->DrawList, "DrawList");
            ImGui::BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->ContentSize.x, window->ContentSize.y);
            ImGui::BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
                (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
                (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
                (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
            ImGui::BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s", window->Scroll.x, window->ScrollMax.x, window->Scroll.y, window->ScrollMax.y, window->ScrollbarX ? "X" : "", window->ScrollbarY ? "Y" : "");
            ImGui::BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
            ImGui::BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
            ImGui::BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X", window->NavLastIds[0], window->NavLastIds[1], window->DC.NavLayerActiveMask);
            ImGui::BulletText("NavLastChildNavWindow: %s", window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
            if (!window->NavRectRel[0].IsInverted())
                ImGui::BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)", window->NavRectRel[0].Min.x, window->NavRectRel[0].Min.y, window->NavRectRel[0].Max.x, window->NavRectRel[0].Max.y);
            else
                ImGui::BulletText("NavRectRel[0]: <None>");
            if (window->RootWindow != window) NodeWindow(window->RootWindow, "RootWindow");
            if (window->ParentWindow != NULL) NodeWindow(window->ParentWindow, "ParentWindow");
            if (window->DC.ChildWindows.Size > 0) NodeWindows(window->DC.ChildWindows, "ChildWindows");
            if (window->ColumnsStorage.Size > 0 && ImGui::TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
            {
                for (int n = 0; n < window->ColumnsStorage.Size; n++)
                    NodeColumns(&window->ColumnsStorage[n]);
                ImGui::TreePop();
            }
            NodeStorage(&window->StateStorage, "Storage");
            ImGui::TreePop();
        }